

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlslangToSpv.cpp
# Opt level: O3

StorageClass __thiscall
anon_unknown.dwarf_ddf01b::TGlslangToSpvTraverser::TranslateStorageClass
          (TGlslangToSpvTraverser *this,TType *type)

{
  uint uVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  StorageClass SVar3;
  Capability local_20 [2];
  
  iVar2 = (*type->_vptr_TType[7])(type);
  if (iVar2 == 0x13) {
    return Private;
  }
  iVar2 = (*type->_vptr_TType[7])(type);
  if (iVar2 == 0x14) {
    return Private;
  }
  iVar2 = (*type->_vptr_TType[0xb])(type);
  if ((*(byte *)(CONCAT44(extraout_var,iVar2) + 0xf) & 8) != 0) {
    iVar2 = (*type->_vptr_TType[0xb])(type);
    uVar1 = *(uint *)(CONCAT44(extraout_var_03,iVar2) + 8);
    if (((uVar1 & 0x7f) < 0x14) && ((0xd0000U >> (uVar1 & 0x1f) & 1) != 0)) {
      return Function;
    }
    iVar2 = (*type->_vptr_TType[0xb])(type);
    if ((*(uint *)(CONCAT44(extraout_var_04,iVar2) + 8) & 0x7f) - 0x11 < 2) {
      return Function;
    }
  }
  iVar2 = (*type->_vptr_TType[0xb])(type);
  uVar1 = *(uint *)(CONCAT44(extraout_var_00,iVar2) + 8);
  if (((uVar1 & 0x7f) < 0x1c) && ((0xe300008U >> (uVar1 & 0x1f) & 1) != 0)) {
    return Input;
  }
  iVar2 = (*type->_vptr_TType[0xb])(type);
  uVar1 = *(uint *)(CONCAT44(extraout_var_01,iVar2) + 8);
  if (((uVar1 & 0x7f) < 0x1f) && ((0x71c00010U >> (uVar1 & 0x1f) & 1) != 0)) {
    return Output;
  }
  iVar2 = (*type->_vptr_TType[0xb])(type);
  if (((*(uint *)(CONCAT44(extraout_var_02,iVar2) + 8) & 0x7f) == 0x1f) ||
     (iVar2 = (*type->_vptr_TType[0x2a])(type), (char)iVar2 != '\0')) {
    spv::Builder::addExtension(&this->builder,"SPV_EXT_shader_tile_image");
    local_20[0] = CapabilityTileImageColorReadAccessEXT;
    std::
    _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
    ::_M_insert_unique<spv::Capability_const&>
              ((_Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
                *)&(this->builder).capabilities,local_20);
    return StorageClassTileImageEXT;
  }
  if ((this->glslangIntermediate->source != EShSourceHlsl) ||
     (iVar2 = (*type->_vptr_TType[0xb])(type),
     (*(uint *)(CONCAT44(extraout_var_05,iVar2) + 8) & 0x7f) == 5)) {
    if (type->field_0x8 == '\r') {
      return AtomicCounter;
    }
    iVar2 = (*type->_vptr_TType[0x36])(type);
    if (((char)iVar2 != '\0') &&
       ((this->glslangIntermediate->bindlessImageModeCaller)._M_t._M_impl.super__Rb_tree_header.
        _M_node_count == 0 &&
        (this->glslangIntermediate->bindlessTextureModeCaller)._M_t._M_impl.super__Rb_tree_header.
        _M_node_count == 0)) {
      return StorageClassUniformConstant;
    }
  }
  iVar2 = (*type->_vptr_TType[0xb])(type);
  if (((*(uint *)(CONCAT44(extraout_var_06,iVar2) + 8) & 0x7f) - 5 < 2) &&
     (iVar2 = (*type->_vptr_TType[0xb])(type),
     *(char *)(CONCAT44(extraout_var_07,iVar2) + 0x38) != '\0')) {
    return ShaderRecordBufferKHR;
  }
  if ((this->glslangIntermediate->useStorageBuffer == true) &&
     (iVar2 = (*type->_vptr_TType[0xb])(type),
     (*(uint *)(CONCAT44(extraout_var_08,iVar2) + 8) & 0x7f) == 6)) {
    if (0x102ff < (this->builder).spvVersion) {
      return StorageBuffer;
    }
    spv::Builder::addExtension(&this->builder,"SPV_KHR_storage_buffer_storage_class");
    return StorageBuffer;
  }
  iVar2 = (*type->_vptr_TType[0xb])(type);
  uVar1 = *(uint *)(CONCAT44(extraout_var_09,iVar2) + 8);
  iVar2 = (*type->_vptr_TType[0xb])(type);
  if ((uVar1 & 0x7f) - 5 < 2) {
    if (*(char *)(CONCAT44(extraout_var_10,iVar2) + 0x2d) != '\0') {
      return PushConstant;
    }
    iVar2 = (*type->_vptr_TType[7])(type);
    return (uint)(iVar2 == 0x10) * 2;
  }
  if (((*(uint *)(CONCAT44(extraout_var_10,iVar2) + 8) & 0x7f) == 7) &&
     (iVar2 = (*type->_vptr_TType[7])(type), iVar2 == 0x10)) {
    spv::Builder::addExtension(&this->builder,"SPV_KHR_workgroup_memory_explicit_layout");
    local_20[1] = 0x114c;
    std::
    _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
    ::_M_insert_unique<spv::Capability_const&>
              ((_Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
                *)&(this->builder).capabilities,local_20 + 1);
switchD_003b6a21_caseD_7:
    SVar3 = StorageClassWorkgroup;
  }
  else {
    iVar2 = (*type->_vptr_TType[0xb])(type);
    SVar3 = Private;
    switch(*(uint *)(CONCAT44(extraout_var_11,iVar2) + 8) & 0x7f) {
    case 0:
    case 0x13:
      SVar3 = Function;
      break;
    case 1:
      break;
    default:
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/GlslangToSpv.cpp"
                    ,0x55f,
                    "spv::StorageClass (anonymous namespace)::TGlslangToSpvTraverser::TranslateStorageClass(const glslang::TType &)"
                   );
    case 7:
      goto switchD_003b6a21_caseD_7;
    case 8:
      iVar2 = (*type->_vptr_TType[0xb])(type);
      SVar3 = *(StorageClass *)(CONCAT44(extraout_var_12,iVar2) + 0x3c);
      break;
    case 9:
      SVar3 = RayPayloadKHR;
      break;
    case 10:
      SVar3 = IncomingRayPayloadKHR;
      break;
    case 0xb:
      SVar3 = HitAttributeKHR;
      break;
    case 0xc:
      SVar3 = CallableDataKHR;
      break;
    case 0xd:
      SVar3 = IncomingCallableDataKHR;
      break;
    case 0xe:
      SVar3 = HitObjectAttributeNV;
      break;
    case 0xf:
      SVar3 = StorageClassTaskPayloadWorkgroupEXT;
    }
  }
  return SVar3;
}

Assistant:

spv::StorageClass TGlslangToSpvTraverser::TranslateStorageClass(const glslang::TType& type)
{
    if (type.getBasicType() == glslang::EbtRayQuery || type.getBasicType() == glslang::EbtHitObjectNV)
        return spv::StorageClassPrivate;
    if (type.getQualifier().isSpirvByReference()) {
        if (type.getQualifier().isParamInput() || type.getQualifier().isParamOutput())
            return spv::StorageClassFunction;
    }
    if (type.getQualifier().isPipeInput())
        return spv::StorageClassInput;
    if (type.getQualifier().isPipeOutput())
        return spv::StorageClassOutput;
    if (type.getQualifier().storage == glslang::EvqTileImageEXT || type.isAttachmentEXT()) {
        builder.addExtension(spv::E_SPV_EXT_shader_tile_image);
        builder.addCapability(spv::CapabilityTileImageColorReadAccessEXT);
        return spv::StorageClassTileImageEXT;
    }

    if (glslangIntermediate->getSource() != glslang::EShSourceHlsl ||
            type.getQualifier().storage == glslang::EvqUniform) {
        if (type.isAtomic())
            return spv::StorageClassAtomicCounter;
        if (type.containsOpaque() && !glslangIntermediate->getBindlessMode())
            return spv::StorageClassUniformConstant;
    }

    if (type.getQualifier().isUniformOrBuffer() &&
        type.getQualifier().isShaderRecord()) {
        return spv::StorageClassShaderRecordBufferKHR;
    }

    if (glslangIntermediate->usingStorageBuffer() && type.getQualifier().storage == glslang::EvqBuffer) {
        builder.addIncorporatedExtension(spv::E_SPV_KHR_storage_buffer_storage_class, spv::Spv_1_3);
        return spv::StorageClassStorageBuffer;
    }

    if (type.getQualifier().isUniformOrBuffer()) {
        if (type.getQualifier().isPushConstant())
            return spv::StorageClassPushConstant;
        if (type.getBasicType() == glslang::EbtBlock)
            return spv::StorageClassUniform;
        return spv::StorageClassUniformConstant;
    }

    if (type.getQualifier().storage == glslang::EvqShared && type.getBasicType() == glslang::EbtBlock) {
        builder.addExtension(spv::E_SPV_KHR_workgroup_memory_explicit_layout);
        builder.addCapability(spv::CapabilityWorkgroupMemoryExplicitLayoutKHR);
        return spv::StorageClassWorkgroup;
    }

    switch (type.getQualifier().storage) {
    case glslang::EvqGlobal:        return spv::StorageClassPrivate;
    case glslang::EvqConstReadOnly: return spv::StorageClassFunction;
    case glslang::EvqTemporary:     return spv::StorageClassFunction;
    case glslang::EvqShared:           return spv::StorageClassWorkgroup;
    case glslang::EvqPayload:        return spv::StorageClassRayPayloadKHR;
    case glslang::EvqPayloadIn:      return spv::StorageClassIncomingRayPayloadKHR;
    case glslang::EvqHitAttr:        return spv::StorageClassHitAttributeKHR;
    case glslang::EvqCallableData:   return spv::StorageClassCallableDataKHR;
    case glslang::EvqCallableDataIn: return spv::StorageClassIncomingCallableDataKHR;
    case glslang::EvqtaskPayloadSharedEXT : return spv::StorageClassTaskPayloadWorkgroupEXT;
    case glslang::EvqHitObjectAttrNV: return spv::StorageClassHitObjectAttributeNV;
    case glslang::EvqSpirvStorageClass: return static_cast<spv::StorageClass>(type.getQualifier().spirvStorageClass);
    default:
        assert(0);
        break;
    }

    return spv::StorageClassFunction;
}